

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O1

int mbedtls_ecdsa_sign_det
              (mbedtls_ecp_group *grp,mbedtls_mpi *r,mbedtls_mpi *s,mbedtls_mpi *d,uchar *buf,
              size_t blen,mbedtls_md_type_t md_alg)

{
  int iVar1;
  mbedtls_ecdsa_restart_ctx *unaff_retaddr;
  
  iVar1 = ecdsa_sign_det_restartable
                    (grp,r,s,d,buf,blen,md_alg,(_func_int_void_ptr_uchar_ptr_size_t *)0x0,
                     (void *)0x0,unaff_retaddr);
  return iVar1;
}

Assistant:

int mbedtls_ecdsa_sign_det( mbedtls_ecp_group *grp, mbedtls_mpi *r,
                            mbedtls_mpi *s, const mbedtls_mpi *d,
                            const unsigned char *buf, size_t blen,
                            mbedtls_md_type_t md_alg )
{
    ECDSA_VALIDATE_RET( grp   != NULL );
    ECDSA_VALIDATE_RET( r     != NULL );
    ECDSA_VALIDATE_RET( s     != NULL );
    ECDSA_VALIDATE_RET( d     != NULL );
    ECDSA_VALIDATE_RET( buf   != NULL || blen == 0 );

    return( ecdsa_sign_det_restartable( grp, r, s, d, buf, blen, md_alg,
                                        NULL, NULL, NULL ) );
}